

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O3

QPainterPath __thiscall QRawFont::pathForGlyph(QRawFont *this,quint32 glyphIndex)

{
  long *plVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  undefined8 local_2c;
  undefined1 local_24 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(long **)CONCAT44(in_register_00000034,glyphIndex) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QPainterPath::QPainterPath((QPainterPath *)this);
      return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
    }
  }
  else {
    local_2c = 0;
    (this->d).d.ptr = (QRawFontPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)this);
    plVar1 = (long *)**(undefined8 **)CONCAT44(in_register_00000034,glyphIndex);
    (**(code **)(*plVar1 + 0x78))(plVar1,local_24,&local_2c,1,this,0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QRawFont::pathForGlyph(quint32 glyphIndex) const
{
    if (!d->isValid())
        return QPainterPath();

    QFixedPoint position;
    QPainterPath path;
    d->fontEngine->addGlyphsToPath(&glyphIndex, &position, 1, &path, { });
    return path;
}